

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_other_examples.cpp
# Opt level: O2

void badDecoding_corruptChecksum(void)

{
  uint __line;
  char *__assertion;
  DecodedResult decodedResult;
  string bstr;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bstr,"example1qpzry9x8ge8sqgv",(allocator<char> *)&decodedResult);
  bstr._M_dataplus._M_p[0x13] = 'q';
  bech32::decode(&decodedResult,&bstr);
  if ((decodedResult.hrp._M_string_length == 0) &&
     (decodedResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      decodedResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (decodedResult.encoding == Invalid) {
      bech32::DecodedResult::~DecodedResult(&decodedResult);
      std::__cxx11::string::~string((string *)&bstr);
      return;
    }
    __assertion = "bech32::Encoding::Invalid == decodedResult.encoding";
    __line = 0x72;
  }
  else {
    __assertion = "decodedResult.hrp.empty() && decodedResult.dp.empty()";
    __line = 0x71;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/examples/cpp_other_examples.cpp"
                ,__line,"void badDecoding_corruptChecksum()");
}

Assistant:

void badDecoding_corruptChecksum() {

    // valid bech32 string
    std::string bstr = "example1qpzry9x8ge8sqgv";
    // simulate corrupted checksum--verification will fail
    bstr[19] = 'q';

    // decode
    bech32::DecodedResult decodedResult = bech32::decode(bstr);

    // verify decoding failed
    assert(decodedResult.hrp.empty() && decodedResult.dp.empty());
    assert(bech32::Encoding::Invalid == decodedResult.encoding);
}